

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int ffh_resume(lua_State *L,lua_State *co,int wrap)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  ErrMsg em;
  
  em = LJ_ERR_CORUN;
  if (co->cframe == (void *)0x0) {
    em = LJ_ERR_CODEAD;
    if ((co->status < 2) && ((co->status != 0 || (co->top != co->base)))) {
      lj_state_growstack(co,(MSize)((ulong)((long)L->top - (long)L->base) >> 3));
      return 0;
    }
  }
  if (wrap == 0) {
    *(undefined4 *)((long)L->base + -4) = 0xfffffffe;
    pTVar1 = L->base;
    pGVar2 = lj_err_str(L,em);
    (pTVar1->u32).lo = (uint32_t)pGVar2;
    (pTVar1->field_2).it = 0xfffffffb;
    return 3;
  }
  lj_err_caller(L,em);
}

Assistant:

static int ffh_resume(lua_State *L, lua_State *co, int wrap)
{
  if (co->cframe != NULL || co->status > LUA_YIELD ||
      (co->status == 0 && co->top == co->base)) {
    ErrMsg em = co->cframe ? LJ_ERR_CORUN : LJ_ERR_CODEAD;
    if (wrap) lj_err_caller(L, em);
    setboolV(L->base-1, 0);
    setstrV(L, L->base, lj_err_str(L, em));
    return FFH_RES(2);
  }
  lj_state_growstack(co, (MSize)(L->top - L->base));
  return FFH_RETRY;
}